

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

size_t __thiscall ezc3d::ParametersNS::Parameters::groupIdx(Parameters *this,string *groupName)

{
  int iVar1;
  char *pcVar2;
  Group *this_00;
  string *psVar3;
  invalid_argument *this_01;
  size_t i;
  size_t in_stack_00000088;
  Parameters *in_stack_00000090;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *pcVar4;
  char *__lhs;
  
  pcVar4 = (char *)0x0;
  while( true ) {
    __lhs = pcVar4;
    pcVar2 = (char *)nbGroups((Parameters *)0x173fa5);
    if (pcVar2 <= pcVar4) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(__lhs,in_stack_ffffffffffffffe0);
      std::invalid_argument::invalid_argument(this_01,local_38);
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_00 = group(in_stack_00000090,in_stack_00000088);
    psVar3 = GroupNS::Group::name_abi_cxx11_(this_00);
    iVar1 = std::__cxx11::string::compare((string *)psVar3);
    if (iVar1 == 0) break;
    pcVar4 = __lhs + 1;
  }
  return (size_t)__lhs;
}

Assistant:

size_t
ezc3d::ParametersNS::Parameters::groupIdx(const std::string &groupName) const {
  for (size_t i = 0; i < nbGroups(); ++i)
    if (!group(i).name().compare(groupName))
      return i;
  throw std::invalid_argument("Parameters::groupIdx could not find " +
                              groupName);
}